

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O3

char * icetStrategyNameFromEnum(IceTEnum strategy)

{
  char *pcVar1;
  
  switch(strategy) {
  case 0x6001:
    return "Direct";
  case 0x6002:
    return "Sequential";
  case 0x6003:
    return "Split";
  case 0x6004:
    return "Reduce";
  case 0x6005:
    return "Virtual Tree";
  }
  if (strategy == 0xffffffff) {
    icetRaiseDiagnostic("Strategy not defined. Use icetStrategy to set the strategy.",0xfffffffe,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/strategies/select.c"
                        ,0x4d);
    pcVar1 = "<Not Set>";
  }
  else {
    icetRaiseDiagnostic("Invalid strategy.",0xfffffffe,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/strategies/select.c"
                        ,0x50);
    pcVar1 = "<Invalid>";
  }
  return pcVar1;
}

Assistant:

const char *icetStrategyNameFromEnum(IceTEnum strategy)
{
    switch (strategy) {
      case ICET_STRATEGY_DIRECT:        return "Direct";
      case ICET_STRATEGY_SEQUENTIAL:    return "Sequential";
      case ICET_STRATEGY_SPLIT:         return "Split";
      case ICET_STRATEGY_REDUCE:        return "Reduce";
      case ICET_STRATEGY_VTREE:         return "Virtual Tree";
      case ICET_STRATEGY_UNDEFINED:
          icetRaiseError("Strategy not defined. "
                         "Use icetStrategy to set the strategy.",
                         ICET_INVALID_ENUM);
          return "<Not Set>";
      default:
          icetRaiseError("Invalid strategy.", ICET_INVALID_ENUM);
          return "<Invalid>";
    }
}